

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

parser * parser_create(char *buffer,size_t buffer_size)

{
  parser *__ptr;
  map *map;
  
  __ptr = (parser *)malloc(0x30);
  if (__ptr != (parser *)0x0) {
    __ptr->buffer = buffer;
    __ptr->buffer_size = buffer_size;
    __ptr->pos = 0;
    __ptr->line_num = 1;
    __ptr->col_num = 1;
    map = map_init();
    __ptr->variables = map;
    if (map != (map *)0x0) {
      map_set_entry_free_function(map,hashmap_free_callback);
      map_set_setting_flag(map,MAP_FLAG_FREE_ENTRY_KEY);
      return __ptr;
    }
    free(__ptr);
  }
  return (parser *)0x0;
}

Assistant:

struct parser *parser_create(const char *buffer, size_t buffer_size)
{
        struct parser *parser = malloc(sizeof(struct parser));

        if (parser == NULL) {
                return NULL;
        }

        parser->buffer = buffer;
        parser->buffer_size = buffer_size;
        parser->pos = 0;
        parser->line_num = 1;
        parser->col_num = 1;
        parser->variables = map_init();

        if (parser->variables == NULL) {
                free(parser);

                return NULL;
        }

        // Set up hashmap
        map_set_entry_free_function(parser->variables, hashmap_free_callback);

        map_set_setting_flag(parser->variables, MAP_FLAG_FREE_ENTRY_KEY);

        return parser;
}